

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  ostream *stream;
  ColourGuard local_20;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    std::operator<<(this->stream,';');
    stream = this->stream;
    local_20.m_colourImpl = this->colourImpl;
    local_20.m_code = FileName;
    local_20.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_20,stream);
    std::operator<<(stream," expression was:");
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
    printOriginalExpression(this);
    return;
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                stream << colourImpl->guardColour(compactDimColour) << " expression was:";
            }
            printOriginalExpression();
        }
    }